

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::js::Generator::GenerateFieldValueExpression
          (Generator *this,Printer *printer,char *obj_reference,FieldDescriptor *field,
          bool use_default)

{
  int iVar1;
  undefined1 *b;
  char *pcVar2;
  FieldDescriptor *field_00;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *field_01;
  ulong uVar3;
  char *pcVar4;
  once_flag *__once;
  char *pcVar5;
  bool bVar6;
  char *obj_reference_local;
  string local_f0;
  string type;
  string cardinality;
  string default_arg;
  string with_default;
  
  obj_reference_local = obj_reference;
  if (*(once_flag **)(field + 0x30) == (once_flag *)0x0) {
    uVar3 = (ulong)*(uint *)(field + 0x38);
    iVar1 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + uVar3 * 4);
    bVar6 = true;
    if (iVar1 != 6) {
LAB_0024c3d3:
      __once = (once_flag *)0x0;
      goto LAB_0024c3d5;
    }
  }
  else {
    cardinality._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    type._M_dataplus._M_p = (pointer)field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&cardinality,
               (FieldDescriptor **)&type);
    __once = *(once_flag **)(field + 0x30);
    uVar3 = (ulong)*(uint *)(field + 0x38);
    iVar1 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + uVar3 * 4);
    bVar6 = true;
    if (iVar1 != 6) {
      if (__once == (once_flag *)0x0) goto LAB_0024c3d3;
      cardinality._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      type._M_dataplus._M_p = (pointer)field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (__once,(_func_void_FieldDescriptor_ptr **)&cardinality,(FieldDescriptor **)&type);
      uVar3 = (ulong)*(uint *)(field + 0x38);
      iVar1 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + uVar3 * 4);
      __once = *(once_flag **)(field + 0x30);
LAB_0024c3d5:
      bVar6 = iVar1 == 5;
    }
    if (__once != (once_flag *)0x0) {
      cardinality._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      type._M_dataplus._M_p = (pointer)field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (__once,(_func_void_FieldDescriptor_ptr **)&cardinality,(FieldDescriptor **)&type);
      uVar3 = (ulong)*(uint *)(field + 0x38);
    }
  }
  pcVar4 = "WithDefault";
  pcVar5 = "";
  if (!use_default) {
    pcVar4 = "";
  }
  with_default._M_dataplus._M_p = (pointer)&with_default.field_2;
  pcVar2 = pcVar4 + 0xb;
  if (!use_default) {
    pcVar2 = pcVar4;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&with_default,pcVar4,pcVar2);
  b = FieldDescriptor::kTypeToCppTypeMap;
  iVar1 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + uVar3 * 4);
  if (use_default) {
    cardinality._M_dataplus._M_p = ", ";
    cardinality._M_string_length = 2;
    (anonymous_namespace)::JSFieldDefault_abi_cxx11_
              (&local_f0,(_anonymous_namespace_ *)field,field_00);
    type._M_dataplus._M_p = local_f0._M_dataplus._M_p;
    type._M_string_length = local_f0._M_string_length;
    StrCat_abi_cxx11_(&default_arg,(protobuf *)&cardinality,(AlphaNum *)&type,(AlphaNum *)b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
  }
  else {
    default_arg._M_dataplus._M_p = (pointer)&default_arg.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&default_arg,"");
  }
  if (*(int *)(field + 0x3c) == 3) {
    pcVar5 = "Repeated";
  }
  cardinality._M_dataplus._M_p = (pointer)&cardinality.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&cardinality,pcVar5,pcVar5 + (ulong)(*(int *)(field + 0x3c) == 3) * 8);
  type._M_dataplus._M_p = (pointer)&type.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&type);
  field_01 = extraout_RDX;
  if (bVar6) {
    std::__cxx11::string::_M_replace((ulong)&type,0,(char *)type._M_string_length,0x3984ed);
    field_01 = extraout_RDX_00;
  }
  if (iVar1 == 7) {
    std::__cxx11::string::_M_replace((ulong)&type,0,(char *)type._M_string_length,0x396fae);
    field_01 = extraout_RDX_01;
  }
  if ((!bVar6) || (*(int *)(field + 0x3c) == 3 || use_default)) {
    (anonymous_namespace)::JSFieldIndex_abi_cxx11_
              (&local_f0,(_anonymous_namespace_ *)field,field_01);
    io::Printer::
    Print<char[12],std::__cxx11::string,char[5],std::__cxx11::string,char[13],std::__cxx11::string,char[4],char_const*,char[6],std::__cxx11::string,char[8],std::__cxx11::string>
              (printer,
               "jspb.Message.get$cardinality$$type$Field$with_default$($obj$, $index$$default$)",
               (char (*) [12])"cardinality",&cardinality,(char (*) [5])0x3e7763,&type,
               (char (*) [13])"with_default",&with_default,(char (*) [4])0x399e43,
               &obj_reference_local,(char (*) [6])0x3a4ffa,&local_f0,(char (*) [8])0x3985a0,
               &default_arg);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p == &local_f0.field_2) goto LAB_0024c650;
  }
  else {
    (anonymous_namespace)::JSFieldIndex_abi_cxx11_
              (&local_f0,(_anonymous_namespace_ *)field,field_01);
    io::Printer::
    Print<char[4],char_const*,char[6],std::__cxx11::string,char[8],std::__cxx11::string>
              (printer,"jspb.Message.getOptionalFloatingPointField($obj$, $index$$default$)",
               (char (*) [4])0x399e43,&obj_reference_local,(char (*) [6])0x3a4ffa,&local_f0,
               (char (*) [8])0x3985a0,&default_arg);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p == &local_f0.field_2) goto LAB_0024c650;
  }
  operator_delete(local_f0._M_dataplus._M_p);
LAB_0024c650:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)type._M_dataplus._M_p != &type.field_2) {
    operator_delete(type._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cardinality._M_dataplus._M_p != &cardinality.field_2) {
    operator_delete(cardinality._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)default_arg._M_dataplus._M_p != &default_arg.field_2) {
    operator_delete(default_arg._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)with_default._M_dataplus._M_p != &with_default.field_2) {
    operator_delete(with_default._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Generator::GenerateFieldValueExpression(io::Printer* printer,
                                             const char* obj_reference,
                                             const FieldDescriptor* field,
                                             bool use_default) const {
  const bool is_float_or_double =
      field->cpp_type() == FieldDescriptor::CPPTYPE_FLOAT ||
      field->cpp_type() == FieldDescriptor::CPPTYPE_DOUBLE;
  const bool is_boolean = field->cpp_type() == FieldDescriptor::CPPTYPE_BOOL;

  const string with_default = use_default ? "WithDefault" : "";
  const string default_arg =
      use_default ? StrCat(", ", JSFieldDefault(field)) : "";
  const string cardinality = field->is_repeated() ? "Repeated" : "";
  string type = "";
  if (is_float_or_double) {
    type = "FloatingPoint";
  }
  if (is_boolean) {
    type = "Boolean";
  }

  // Prints the appropriate function, among:
  // - getField
  // - getBooleanField
  // - getFloatingPointField => Replaced by getOptionalFloatingPointField to
  //   preserve backward compatibility.
  // - getFieldWithDefault
  // - getBooleanFieldWithDefault
  // - getFloatingPointFieldWithDefault
  // - getRepeatedField
  // - getRepeatedBooleanField
  // - getRepeatedFloatingPointField
  if (is_float_or_double && !field->is_repeated() && !use_default) {
    printer->Print(
        "jspb.Message.getOptionalFloatingPointField($obj$, "
        "$index$$default$)",
        "obj", obj_reference, "index", JSFieldIndex(field), "default",
        default_arg);
  } else {
    printer->Print(
        "jspb.Message.get$cardinality$$type$Field$with_default$($obj$, "
        "$index$$default$)",
        "cardinality", cardinality, "type", type, "with_default", with_default,
        "obj", obj_reference, "index", JSFieldIndex(field), "default",
        default_arg);
  }
}